

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

GCproto * check_Lproto(lua_State *L,int nolua)

{
  int iVar1;
  int iVar2;
  lua_State *L_00;
  int in_ESI;
  long in_RDI;
  TValue *o;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  GCproto *local_8;
  
  L_00 = *(lua_State **)(in_RDI + 0x10);
  if (*(lua_State **)(in_RDI + 0x18) <= L_00) {
LAB_001396de:
    lj_err_argt(L_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  iVar1._0_1_ = L_00->marked;
  iVar1._1_1_ = L_00->gct;
  iVar1._2_1_ = L_00->dummy_ffid;
  iVar1._3_1_ = L_00->status;
  if (iVar1 == -8) {
    local_8 = (GCproto *)(ulong)(L_00->nextgc).gcptr32;
  }
  else {
    iVar2._0_1_ = L_00->marked;
    iVar2._1_1_ = L_00->gct;
    iVar2._2_1_ = L_00->dummy_ffid;
    iVar2._3_1_ = L_00->status;
    if (iVar2 != -9) goto LAB_001396de;
    if (*(char *)((ulong)(L_00->nextgc).gcptr32 + 6) == '\0') {
      local_8 = (GCproto *)((ulong)*(uint *)((ulong)(L_00->nextgc).gcptr32 + 0x10) - 0x40);
    }
    else {
      if (in_ESI == 0) goto LAB_001396de;
      local_8 = (GCproto *)0x0;
    }
  }
  return local_8;
}

Assistant:

static GCproto *check_Lproto(lua_State *L, int nolua)
{
  TValue *o = L->base;
  if (L->top > o) {
    if (tvisproto(o)) {
      return protoV(o);
    } else if (tvisfunc(o)) {
      if (isluafunc(funcV(o)))
	return funcproto(funcV(o));
      else if (nolua)
	return NULL;
    }
  }
  lj_err_argt(L, 1, LUA_TFUNCTION);
  return NULL;  /* unreachable */
}